

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_converters.h
# Opt level: O1

string * __thiscall
common::vector_to_string_abi_cxx11_
          (string *__return_storage_ptr__,common *this,vector<double,_std::allocator<double>_> *v)

{
  undefined8 *puVar1;
  string *psVar2;
  size_t sVar3;
  long *plVar4;
  long *plVar5;
  undefined8 *puVar6;
  char int_part [2];
  char local_82 [2];
  string *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  local_80 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{","");
  puVar6 = *(undefined8 **)this;
  puVar1 = *(undefined8 **)(this + 8);
  if (puVar6 != puVar1) {
    do {
      sprintf(local_82,"%.0f",(int)*puVar6);
      local_50[0] = local_40;
      sVar3 = strlen(local_82);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,local_82,local_82 + sVar3);
      plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_60 = *plVar5;
        lStack_58 = plVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar5;
        local_70 = (long *)*plVar4;
      }
      local_68 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_80,(ulong)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  psVar2 = local_80;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::append((char *)psVar2);
  return psVar2;
}

Assistant:

const std::string vector_to_string(const std::vector<double>& v) {
  char int_part[2];
  // printf ("[%s] is a string %d chars long\n",buffer,n);
  std::string s("{");
  for (auto e : v) {
    sprintf(int_part, "%.0f", e);
    s += std::string(int_part) + ",";
  }
  s.pop_back();
  s += "}";
  return s;
}